

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info(char *filename,int *x,int *y,int *comp)

{
  FILE *__stream;
  int result;
  FILE *f;
  int *comp_local;
  int *y_local;
  int *x_local;
  char *filename_local;
  
  __stream = (FILE *)stbi__fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = stbi__err("can\'t fopen");
  }
  else {
    filename_local._4_4_ = stbi_info_from_file((FILE *)__stream,x,y,comp);
    fclose(__stream);
  }
  return filename_local._4_4_;
}

Assistant:

STBIDEF int stbi_info(char const *filename, int *x, int *y, int *comp)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_info_from_file(f, x, y, comp);
    fclose(f);
    return result;
}